

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsontest.h
# Opt level: O0

TestResult *
JsonTest::checkEqual<char_const*,std::__cxx11::string>
          (TestResult *result,char *expected,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *actual,char *file,
          uint line,char *expr)

{
  byte bVar1;
  char *in_RSI;
  TestResult *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_000000d8;
  TestResult *in_stack_000000e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  uint line_00;
  char *in_stack_ffffffffffffff48;
  allocator *paVar2;
  undefined7 in_stack_ffffffffffffff50;
  allocator local_89;
  string local_88 [55];
  allocator local_51;
  string local_50 [64];
  char *local_10;
  TestResult *local_8;
  
  line_00 = (uint)((ulong)in_stack_ffffffffffffff40 >> 0x20);
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,in_RSI,&local_51);
  bVar1 = std::operator!=(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  if ((bVar1 & 1) != 0) {
    TestResult::addFailure
              ((TestResult *)CONCAT17(bVar1,in_stack_ffffffffffffff50),in_stack_ffffffffffffff48,
               line_00,in_stack_ffffffffffffff38);
    TestResult::operator<<(in_stack_000000e0,(char (*) [11])in_stack_000000d8);
    paVar2 = &local_89;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,local_10,paVar2);
    TestResult::operator<<(in_stack_000000e0,in_stack_000000d8);
    TestResult::operator<<(in_stack_000000e0,(char (*) [2])in_stack_000000d8);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    TestResult::operator<<(in_stack_000000e0,(char (*) [11])in_stack_000000d8);
    TestResult::operator<<(in_stack_000000e0,in_stack_000000d8);
  }
  return local_8;
}

Assistant:

TestResult& checkEqual(TestResult& result,
                       T expected,
                       U actual,
                       const char* file,
                       unsigned int line,
                       const char* expr) {
  if (static_cast<U>(expected) != actual) {
    result.addFailure(file, line, expr);
    result << "Expected: " << static_cast<U>(expected) << "\n";
    result << "Actual  : " << actual;
  }
  return result;
}